

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_tdes_wrap.c
# Opt level: O0

int tdes_wrap_cipher(void *vctx,uchar *out,size_t *outl,size_t outsize,uchar *in,size_t inl)

{
  int iVar1;
  PROV_CIPHER_CTX *in_RCX;
  long *in_RDX;
  uchar *in_RDI;
  char *in_R8;
  PROV_CIPHER_CTX *in_R9;
  int ret;
  PROV_CIPHER_CTX *ctx;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 local_4;
  
  *in_RDX = 0;
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else if (in_RCX < in_R9) {
    ERR_new();
    ERR_set_debug(in_R8,(int)((ulong)in_R9 >> 0x20),(char *)in_RDI);
    ERR_set_error(0x39,0x6a,(char *)0x0);
    local_4 = 0;
  }
  else {
    iVar1 = tdes_wrap_cipher_internal
                      (in_R9,in_RDI,
                       (uchar *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       0x301840);
    if (iVar1 < 1) {
      local_4 = 0;
    }
    else {
      *in_RDX = (long)iVar1;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int tdes_wrap_cipher(void *vctx,
                            unsigned char *out, size_t *outl, size_t outsize,
                            const unsigned char *in, size_t inl)
{
    PROV_CIPHER_CTX *ctx = (PROV_CIPHER_CTX *)vctx;
    int ret;

    *outl = 0;
    if (!ossl_prov_is_running())
        return 0;

    if (outsize < inl) {
        ERR_raise(ERR_LIB_PROV, PROV_R_OUTPUT_BUFFER_TOO_SMALL);
        return 0;
    }

    ret = tdes_wrap_cipher_internal(ctx, out, in, inl);
    if (ret <= 0)
        return 0;

    *outl = ret;
    return 1;
}